

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.h
# Opt level: O2

void __thiscall
google::protobuf::
Map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long>::InnerMap
::Resize(InnerMap *this,size_t new_num_buckets)

{
  ulong n;
  void **t;
  LogMessage *other;
  void **ppvVar1;
  size_type index;
  LogFinisher local_61;
  LogMessage local_60;
  ulong uVar2;
  
  if (new_num_buckets < 8) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/map.h"
               ,0x2ec);
    other = internal::LogMessage::operator<<
                      (&local_60,"CHECK failed: (new_num_buckets) >= (kMinTableSize): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  n = this->num_buckets_;
  t = this->table_;
  this->num_buckets_ = new_num_buckets;
  ppvVar1 = CreateEmptyTable(this,new_num_buckets);
  this->table_ = ppvVar1;
  index = this->index_of_first_non_null_;
  this->index_of_first_non_null_ = this->num_buckets_;
  while (index < n) {
    uVar2 = index;
    if (t[index] != (void *)0x0) {
      if (t[index] == t[index ^ 1]) {
        uVar2 = index + 1;
        TransferTree(this,t,index);
      }
      else {
        TransferList(this,t,index);
      }
    }
    index = uVar2 + 1;
  }
  Map<std::__cxx11::string,long>::InnerMap::Dealloc<void*>((InnerMap *)this,t,n);
  return;
}

Assistant:

void Resize(size_t new_num_buckets) {
      GOOGLE_DCHECK_GE(new_num_buckets, kMinTableSize);
      void** const old_table = table_;
      const size_type old_table_size = num_buckets_;
      num_buckets_ = new_num_buckets;
      table_ = CreateEmptyTable(num_buckets_);
      const size_type start = index_of_first_non_null_;
      index_of_first_non_null_ = num_buckets_;
      for (size_type i = start; i < old_table_size; i++) {
        if (TableEntryIsNonEmptyList(old_table, i)) {
          TransferList(old_table, i);
        } else if (TableEntryIsTree(old_table, i)) {
          TransferTree(old_table, i++);
        }
      }
      Dealloc<void*>(old_table, old_table_size);
    }